

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

InlineeFrameRecord * __thiscall InlineeFrameRecord::Reverse(InlineeFrameRecord *this)

{
  InlineeFrameRecord *pIVar1;
  InlineeFrameRecord *next;
  InlineeFrameRecord *current;
  InlineeFrameRecord *prev;
  InlineeFrameRecord *this_local;
  
  current = (InlineeFrameRecord *)0x0;
  next = this;
  while (next != (InlineeFrameRecord *)0x0) {
    pIVar1 = next->parent;
    next->parent = current;
    current = next;
    next = pIVar1;
  }
  return current;
}

Assistant:

InlineeFrameRecord* InlineeFrameRecord::Reverse()
{
    InlineeFrameRecord * prev = nullptr;
    InlineeFrameRecord * current = this;
    while (current)
    {
        InlineeFrameRecord * next = current->parent;
        current->parent = prev;
        prev = current;
        current = next;
    }
    return prev;
}